

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

unsigned_short __thiscall
winmd::reader::table_base::get_value<unsigned_short>(table_base *this,uint32_t row,uint32_t column)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  const_reference pvVar4;
  ushort *puVar5;
  uint uVar6;
  uint64_t temp_3;
  uint32_t temp_2;
  uint16_t temp_1;
  uint8_t temp;
  uint8_t *ptr;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  uint32_t local_20;
  uint32_t data_size;
  uint32_t column_local;
  uint32_t row_local;
  table_base *this_local;
  
  local_20 = column;
  data_size = row;
  _column_local = this;
  pvVar4 = cppwinrt::std::array<winmd::reader::table_base::column,_6UL>::operator[]
                     (&this->m_columns,(ulong)column);
  uVar2 = data_size;
  local_24 = (uint)pvVar4->size;
  uVar3 = size(this);
  if (uVar3 < uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Invalid row index",&local_49);
    impl::throw_invalid(&local_48);
  }
  puVar1 = this->m_data;
  uVar6 = data_size * this->m_row_size;
  pvVar4 = cppwinrt::std::array<winmd::reader::table_base::column,_6UL>::operator[]
                     (&this->m_columns,(ulong)local_20);
  puVar5 = (ushort *)(puVar1 + (ulong)pvVar4->offset + (ulong)uVar6);
  if (local_24 == 1) {
    this_local._6_2_ = (ushort)(byte)*puVar5;
  }
  else if (local_24 == 2) {
    this_local._6_2_ = *puVar5;
  }
  else if (local_24 == 4) {
    this_local._6_2_ = (ushort)*(undefined4 *)puVar5;
  }
  else {
    this_local._6_2_ = (ushort)*(undefined8 *)puVar5;
  }
  return this_local._6_2_;
}

Assistant:

T get_value(uint32_t const row, uint32_t const column) const
        {
            static_assert(std::is_enum_v<T> || std::is_integral_v<T>);
            uint32_t const data_size = m_columns[column].size;
            XLANG_ASSERT(data_size == 1 || data_size == 2 || data_size == 4 || data_size == 8);
            XLANG_ASSERT(data_size <= sizeof(T));

            if (row > size())
            {
                impl::throw_invalid("Invalid row index");
            }

            uint8_t const* ptr = m_data + row * m_row_size + m_columns[column].offset;
            switch (data_size)
            {
            case  1:
            {
                uint8_t temp = *ptr;
                return static_cast<T>(temp);
            }
            case 2:
            {
                uint16_t temp = *reinterpret_cast<uint16_t const*>(ptr);
                return static_cast<T>(temp);
            }
            case 4:
            {
                uint32_t temp = *reinterpret_cast<uint32_t const*>(ptr);
                return static_cast<T>(temp);
            }
            default:
            {
                uint64_t temp = *reinterpret_cast<uint64_t const*>(ptr);
                return static_cast<T>(temp);
            }
            }
        }